

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

int Gia_ObjGetCnfVar(Gia_Man_t *pGia,int iObj,Vec_Ptr_t *vFrontier,Vec_Ptr_t *vFanins,satoko_t *pSat
                    )

{
  int iVar1;
  Vec_Int_t *p;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  void *pvVar6;
  ulong uVar7;
  int nCapMin;
  long lVar8;
  
  pObj = Gia_ManObj(pGia,iObj);
  iVar3 = pGia->nObjs;
  iVar5 = (pGia->vCopies2).nSize;
  if (iVar5 < iVar3) {
    iVar1 = (pGia->vCopies2).nCap;
    iVar2 = iVar1 * 2;
    nCapMin = iVar3;
    if ((iVar2 < iVar3) || (nCapMin = iVar2, iVar1 < iVar3)) {
      Vec_IntGrow(&pGia->vCopies2,nCapMin);
      iVar5 = (pGia->vCopies2).nSize;
    }
    for (lVar8 = (long)iVar5; lVar8 < iVar3; lVar8 = lVar8 + 1) {
      (pGia->vCopies2).pArray[lVar8] = -1;
    }
    (pGia->vCopies2).nSize = iVar3;
  }
  iVar3 = Cec2_ObjSatId(pGia,pObj);
  if (iVar3 < 0) {
    if (iObj < 1) {
      __assert_fail("iObj > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                    ,0x14a,
                    "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)");
    }
    uVar4 = (uint)*(undefined8 *)pObj;
    if ((~uVar4 & 0x9fffffff) == 0) {
      iVar3 = satoko_add_variable(pSat,'\0');
      p = pGia->vVar2Obj;
      if (p != (Vec_Int_t *)0x0) {
        if (p->nSize != iVar3) {
          __assert_fail("Vec_IntSize(pGia->vVar2Obj) == iVar",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                        ,0x150,
                        "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                       );
        }
        Vec_IntPush(p,iObj);
      }
      iVar3 = Cec2_ObjSetSatId(pGia,pObj,iVar3);
      return iVar3;
    }
    if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                    ,0x155,
                    "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)");
    }
    vFrontier->nSize = 0;
    Cec2_ObjAddToFrontier(pGia,pObj,vFrontier,pSat);
    iVar3 = 0;
    while (iVar3 < vFrontier->nSize) {
      pObj_00 = (Gia_Obj_t *)Vec_PtrEntry(vFrontier,iVar3);
      iVar5 = Cec2_ObjSatId(pGia,pObj_00);
      if (iVar5 < 0) {
        __assert_fail("Cec2_ObjSatId(pGia,pNode) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                      ,0x15d,
                      "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                     );
      }
      if ((pObj_00->field_0x3 & 0x40) == 0) {
        Cec2_CollectSuper(pGia,pObj_00,1,vFanins);
        for (iVar5 = 0; iVar5 < vFanins->nSize; iVar5 = iVar5 + 1) {
          pvVar6 = Vec_PtrEntry(vFanins,iVar5);
          Cec2_ObjAddToFrontier
                    (pGia,(Gia_Obj_t *)((ulong)pvVar6 & 0xfffffffffffffffe),vFrontier,pSat);
        }
        Cec2_AddClausesSuper(pGia,pObj_00,vFanins,pSat);
      }
      else {
        vFanins->nSize = 0;
        Vec_PtrPushUnique(vFanins,pObj_00 + (-(*(ulong *)pObj_00 & 0x1fffffff) -
                                            (*(ulong *)(pObj_00 + -(*(ulong *)pObj_00 & 0x1fffffff))
                                            & 0x1fffffff)));
        uVar7 = (ulong)*(uint *)&pObj_00->field_0x4 & 0x1fffffff;
        Vec_PtrPushUnique(vFanins,pObj_00 + (-uVar7 - (*(ulong *)(pObj_00 + -uVar7) & 0x1fffffff)));
        Vec_PtrPushUnique(vFanins,pObj_00 + (-(*(ulong *)pObj_00 & 0x1fffffff) -
                                            ((ulong)*(uint *)&pObj_00[-(*(ulong *)pObj_00 &
                                                                       0x1fffffff)].field_0x4 &
                                            0x1fffffff)));
        uVar7 = (ulong)*(uint *)&pObj_00->field_0x4 & 0x1fffffff;
        Vec_PtrPushUnique(vFanins,pObj_00 + (-uVar7 - ((ulong)*(uint *)&pObj_00[-uVar7].field_0x4 &
                                                      0x1fffffff)));
        for (iVar5 = 0; iVar5 < vFanins->nSize; iVar5 = iVar5 + 1) {
          pvVar6 = Vec_PtrEntry(vFanins,iVar5);
          Cec2_ObjAddToFrontier
                    (pGia,(Gia_Obj_t *)((ulong)pvVar6 & 0xfffffffffffffffe),vFrontier,pSat);
        }
        Cec2_AddClausesMux(pGia,pObj_00,pSat);
      }
      iVar3 = iVar3 + 1;
      if (vFanins->nSize < 2) {
        __assert_fail("Vec_PtrSize(vFanins) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                      ,0x171,
                      "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                     );
      }
    }
  }
  iVar3 = Cec2_ObjSatId(pGia,pObj);
  return iVar3;
}

Assistant:

int Gia_ObjGetCnfVar( Gia_Man_t * pGia, int iObj, Vec_Ptr_t * vFrontier, Vec_Ptr_t * vFanins, satoko_t * pSat )
{ 
    Gia_Obj_t * pNode, * pFanin;
    Gia_Obj_t * pObj = Gia_ManObj(pGia, iObj);
    int i, k, fUseMuxes = 1;
    if ( Vec_IntSize(&pGia->vCopies2) < Gia_ManObjNum(pGia) )
        Vec_IntFillExtra( &pGia->vCopies2, Gia_ManObjNum(pGia), -1 );
    // quit if CNF is ready
    if ( Cec2_ObjSatId(pGia,pObj) >= 0 )
        return Cec2_ObjSatId(pGia,pObj);
    assert( iObj > 0 );
    if ( Gia_ObjIsCi(pObj) )
    {
        int iVar = satoko_add_variable(pSat, 0);
        if ( pGia->vVar2Obj )
        {
            assert( Vec_IntSize(pGia->vVar2Obj) == iVar );
            Vec_IntPush( pGia->vVar2Obj, iObj );
        }
        return Cec2_ObjSetSatId( pGia, pObj, iVar );
    }
    assert( Gia_ObjIsAnd(pObj) );
    // start the frontier
    Vec_PtrClear( vFrontier );
    Cec2_ObjAddToFrontier( pGia, pObj, vFrontier, pSat );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Gia_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Cec2_ObjSatId(pGia,pNode) >= 0 );
        if ( fUseMuxes && pNode->fMark0 )
        {
            Vec_PtrClear( vFanins );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin0( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin0( Gia_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin1( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin1( Gia_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Gia_Obj_t *, vFanins, pFanin, k )
                Cec2_ObjAddToFrontier( pGia, Gia_Regular(pFanin), vFrontier, pSat );
            Cec2_AddClausesMux( pGia, pNode, pSat );
        }
        else
        {
            Cec2_CollectSuper( pGia, pNode, fUseMuxes, vFanins );
            Vec_PtrForEachEntry( Gia_Obj_t *, vFanins, pFanin, k )
                Cec2_ObjAddToFrontier( pGia, Gia_Regular(pFanin), vFrontier, pSat );
            Cec2_AddClausesSuper( pGia, pNode, vFanins, pSat ); 
            //printf( "%d ", Vec_PtrSize(vFanins) );
        }
        assert( Vec_PtrSize(vFanins) > 1 );
    }
    return Cec2_ObjSatId(pGia,pObj);
}